

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int8_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::quantize_gradient_org
          (jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
           *this,int32_t di)

{
  int iVar1;
  int8_t iVar2;
  
  iVar2 = -4;
  if (-this->t3_ < di) {
    iVar2 = -3;
    if (-this->t2_ < di) {
      iVar2 = -2;
      if (-this->t1_ < di) {
        iVar1 = (this->traits_).near_lossless;
        iVar2 = -1;
        if (-iVar1 <= di) {
          if (iVar1 < di) {
            iVar2 = '\x01';
            if ((this->t1_ <= di) && (iVar2 = '\x02', this->t2_ <= di)) {
              return '\x04' - (di < this->t3_);
            }
          }
          else {
            iVar2 = '\0';
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int8_t quantize_gradient_org(const int32_t di) const noexcept
    {
        if (di <= -t3_)
            return -4;
        if (di <= -t2_)
            return -3;
        if (di <= -t1_)
            return -2;
        if (di < -traits_.near_lossless)
            return -1;
        if (di <= traits_.near_lossless)
            return 0;
        if (di < t1_)
            return 1;
        if (di < t2_)
            return 2;
        if (di < t3_)
            return 3;

        return 4;
    }